

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ECUPort.cc
# Opt level: O3

void __thiscall
SSM::ECUPort::continuousRead(ECUPort *this,Observables *observables,ReadValueCallback *callback)

{
  undefined8 *puVar1;
  double dVar2;
  pointer pbVar3;
  pointer pbVar4;
  int iVar5;
  long lVar6;
  undefined8 uVar7;
  pointer pbVar8;
  pointer pbVar9;
  InvalidChecksum anon_var_0;
  Values values;
  Bytes local_78;
  vector<double,_std::allocator<double>_> local_50;
  ECUPort *local_38;
  
  buildReadRequest(&local_78,(ECUPort *)observables,observables,true);
  local_38 = this;
  sendRequest(this,&local_78,3);
  if (local_78.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  std::vector<double,_std::allocator<double>_>::vector
            (&local_50,*(long *)(observables + 8) - *(long *)observables >> 3,
             (allocator_type *)&local_78);
  pbVar8 = (pointer)0x0;
  pbVar9 = (pointer)0x0;
  while( true ) {
    readECUPacket(&local_78,local_38,false);
    pbVar4 = local_78.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    pbVar3 = local_78.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_78.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (pbVar9 != (pointer)0x0) {
      pbVar8 = pbVar8 + -(long)pbVar9;
      operator_delete(pbVar9,(ulong)pbVar8);
      if (local_78.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_78.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_78.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_78.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
    lVar6 = *(long *)observables;
    if (*(long *)(observables + 8) != lVar6) {
      pbVar8 = pbVar3 + 5;
      pbVar9 = (pointer)0x0;
      do {
        puVar1 = *(undefined8 **)(lVar6 + (long)pbVar9 * 8);
        dVar2 = (double)(**(code **)*puVar1)(puVar1,pbVar8);
        local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start[(long)pbVar9] = dVar2;
        iVar5 = (**(code **)(**(long **)(*(long *)observables + (long)pbVar9 * 8) + 0x18))();
        pbVar8 = pbVar8 + iVar5;
        pbVar9 = pbVar9 + 1;
        lVar6 = *(long *)observables;
      } while (pbVar9 < (pointer)(*(long *)(observables + 8) - lVar6 >> 3));
    }
    if (*(long *)(callback + 0x10) == 0) break;
    iVar5 = (**(code **)(callback + 0x18))(callback,observables,&local_50);
    pbVar8 = pbVar4;
    pbVar9 = pbVar3;
    if (iVar5 != 0) {
      if (local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (pbVar3 != (pointer)0x0) {
        operator_delete(pbVar3,(long)pbVar4 - (long)pbVar3);
      }
      return;
    }
  }
  uVar7 = std::__throw_bad_function_call();
  if (local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (pbVar9 != (pointer)0x0) {
    operator_delete(pbVar9,(long)pbVar8 - (long)pbVar9);
  }
  _Unwind_Resume(uVar7);
}

Assistant:

void ECUPort::continuousRead(const Observables& observables,
			       ReadValueCallback callback) const
  {
    sendRequest(buildReadRequest(observables, true));

    Bytes response(0);
    Values values(observables.size());
    Bytes::const_iterator it;

    while(true)
      {
	try { response = readECUPacket(false);}
	catch(InvalidChecksum) { continue; }
	it = skipToData(response);
	for(int i(0); i< observables.size(); i++)
	  {
	    values[i] = observables[i]->convert(it);
	    it += observables[i]->numBytes();
	  }
	if(callback(observables, values)) return;
      }
  }